

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_4e5a3fa::GeneratorStateHelper::IsDone(GeneratorStateHelper *this)

{
  uint uVar1;
  uint uVar2;
  InterpreterStackFrame *this_00;
  ByteCodeReader *this_01;
  FunctionBody *this_02;
  ByteBlock *this_03;
  int endOffset;
  int nextOffset;
  InterpreterStackFrame *frame;
  GeneratorStateHelper *this_local;
  
  this_00 = Js::JavascriptGenerator::GetFrame(this->generator);
  if (((this->didThrow & 1U) == 0) && (this_00 != (InterpreterStackFrame *)0x0)) {
    this_01 = Js::InterpreterStackFrame::GetReader(this_00);
    uVar1 = Js::ByteCodeReader::GetCurrentOffset(this_01);
    this_02 = Js::InterpreterStackFrame::GetFunctionBody(this_00);
    this_03 = Js::FunctionBody::GetByteCode(this_02);
    uVar2 = Js::ByteBlock::GetLength(this_03);
    if (uVar1 == uVar2 - 1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IsDone()
        {
            // If the generator is jit'd, we set its interpreter frame to nullptr at the
            // end right before the epilogue to signal that the generator has completed
            auto* frame = generator->GetFrame();

            if (didThrow || frame == nullptr)
                return true;

            int nextOffset = frame->GetReader()->GetCurrentOffset();
            int endOffset = frame->GetFunctionBody()->GetByteCode()->GetLength();

            if (nextOffset == endOffset - 1)
                return true;

            return false;
        }